

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsontest.cpp
# Opt level: O0

uint __thiscall JsonTest::TestResult::getAssertionNestingLevel(TestResult *this)

{
  PredicateContext *lastNode;
  uint level;
  TestResult *this_local;
  
  level = 0;
  for (lastNode = &this->rootPredicateNode_; lastNode->next_ != (PredicateContext *)0x0;
      lastNode = lastNode->next_) {
    level = level + 1;
  }
  return level;
}

Assistant:

unsigned int TestResult::getAssertionNestingLevel() const {
  unsigned int level = 0;
  const PredicateContext* lastNode = &rootPredicateNode_;
  while (lastNode->next_ != 0) {
    lastNode = lastNode->next_;
    ++level;
  }
  return level;
}